

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O2

TimeAggregate * __thiscall
hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>::
read<hta::TimeAggregate>
          (TimeAggregate *__return_storage_ptr__,
          File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *this)

{
  (__return_storage_ptr__->time).
  super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.__r =
       0;
  (__return_storage_ptr__->aggregate).minimum = INFINITY;
  (__return_storage_ptr__->aggregate).maximum = -INFINITY;
  (__return_storage_ptr__->aggregate).sum = 0.0;
  (__return_storage_ptr__->aggregate).count = 0;
  (__return_storage_ptr__->aggregate).integral = 0.0;
  (__return_storage_ptr__->aggregate).active_time.__r = 0;
  std::istream::read((char *)&this->stream_,(long)__return_storage_ptr__);
  check_stream(this,"read");
  return __return_storage_ptr__;
}

Assistant:

TT read()
    {
        static_assert(std::is_trivially_copyable_v<TT>, "Type must be a trivially copyable.");
        TT thing;
        stream_.read(reinterpret_cast<char*>(&thing), sizeof(thing));
        check_stream("read");
        return thing;
    }